

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

MemoryClass * __thiscall
MMIntern::MemoryClass::readString_abi_cxx11_(MemoryClass *this,size_t _size)

{
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  char *pcVar4;
  ulong in_RDX;
  allocator local_22;
  undefined1 local_21;
  ulong local_20;
  size_t _size_local;
  MemoryClass *this_local;
  string *str;
  
  lVar1 = *(long *)(_size + 0x18);
  local_20 = in_RDX;
  _size_local = _size;
  this_local = this;
  sVar3 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)_size);
  if (sVar3 < lVar1 + in_RDX) {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)_size);
    local_20 = sVar3 - *(long *)(_size + 0x18);
  }
  local_21 = 0;
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)_size);
  uVar2 = local_20;
  lVar1 = *(long *)(_size + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar4 + lVar1,uVar2,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  *(ulong *)(_size + 0x18) = local_20 + *(long *)(_size + 0x18);
  return this;
}

Assistant:

std::string MMIntern::MemoryClass::readString(std::size_t _size)
{
    if (readPos + _size > mem.size())
    {
        _size = mem.size() - readPos;
    }
    std::string str(mem.data() + readPos, _size);
    readPos += _size;
    return str;
}